

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O2

void generate_code_for_list(List *ls,int m68kop,ParsedOpcodeInfo *info,CCVariant *var)

{
  char cVar1;
  byte bVar2;
  uchar uVar3;
  TokenType TVar4;
  anon_union_8_7_0ba269be_for_u aVar5;
  ListStruct **ppLVar6;
  int iVar7;
  TokenType TVar8;
  BOOL BVar9;
  ulong uVar10;
  char *pcVar11;
  ListStruct *pLVar12;
  ulong uVar13;
  uint *info_00;
  CCVariant *pCVar14;
  ListStruct *pLVar15;
  int m68kop_00;
  uint uVar16;
  ParsedOpcodeInfo *info_01;
  ParsedOpcodeInfo *extraout_RDX;
  ParsedOpcodeInfo *extraout_RDX_00;
  ParsedOpcodeInfo *info_02;
  ParsedOpcodeInfo *info_03;
  ParsedOpcodeInfo *info_04;
  ParsedOpcodeInfo *info_05;
  ParsedOpcodeInfo *info_06;
  ParsedOpcodeInfo *info_07;
  ParsedOpcodeInfo *info_08;
  ParsedOpcodeInfo *info_09;
  ParsedOpcodeInfo *info_10;
  ParsedOpcodeInfo *extraout_RDX_01;
  ParsedOpcodeInfo *extraout_RDX_02;
  ParsedOpcodeInfo *extraout_RDX_03;
  ParsedOpcodeInfo *extraout_RDX_04;
  ParsedOpcodeInfo *extraout_RDX_05;
  ParsedOpcodeInfo *extraout_RDX_06;
  ParsedOpcodeInfo *info_11;
  ParsedOpcodeInfo *info_12;
  ParsedOpcodeInfo *extraout_RDX_07;
  ParsedOpcodeInfo *extraout_RDX_08;
  ParsedOpcodeInfo *extraout_RDX_09;
  ParsedOpcodeInfo *extraout_RDX_10;
  ParsedOpcodeInfo *extraout_RDX_11;
  ParsedOpcodeInfo *extraout_RDX_12;
  ParsedOpcodeInfo *pPVar17;
  ParsedOpcodeInfo *extraout_RDX_13;
  ParsedOpcodeInfo *extraout_RDX_14;
  ParsedOpcodeInfo *info_13;
  ParsedOpcodeInfo *info_14;
  FILE *pFVar18;
  char *pcVar19;
  Token *pTVar20;
  List *pLVar21;
  CCVariant *in_R8;
  uint uVar22;
  bool bVar23;
  size_t sStack_240;
  char buf [512];
  
  pFVar18 = (FILE *)(ulong)(uint)m68kop;
  if (ls == (List *)0x0) {
    return;
  }
  pTVar20 = &ls->token;
  TVar4 = (ls->token).type;
  switch(TVar4) {
  case TOK_FALSE:
switchD_0010c773_caseD_0:
    pcVar11 = "0 ";
    break;
  case TOK_TRUE:
    pcVar11 = "1 ";
    break;
  case TOK_IF:
  case TOK_SWITCH:
  case TOK_DEFAULT:
  case TOK_AND:
  case TOK_OR:
  case TOK_XOR:
  case TOK_NOT:
  case TOK_EQUAL:
  case TOK_NOT_EQUAL:
  case TOK_GREATER_THAN:
  case TOK_LESS_THAN:
  case TOK_GREATER_OR_EQUAL:
  case TOK_LESS_OR_EQUAL:
  case TOK_IDENTIFIER:
  case TOK_LEFT_PAREN:
  case TOK_RIGHT_PAREN:
  case TOK_UNION:
  case TOK_INTERSECT:
  case TOK_SHIFT_LEFT:
  case TOK_SHIFT_RIGHT:
  case TOK_ASSIGN:
  case TOK_PLUS:
  case TOK_MINUS:
  case TOK_MULTIPLY:
  case TOK_DIVIDE:
  case TOK_MOD:
  case TOK_BITWISE_AND:
  case TOK_BITWISE_OR:
  case TOK_BITWISE_XOR:
  case TOK_BITWISE_NOT:
  case TOK_NUMARGS:
  case TOK_NIL:
  case TOK_FUNC_CALL:
  case TOK_CAST:
  case TOK_DEREF:
switchD_0010c773_caseD_2:
    pcVar11 = unparse_token(pTVar20,buf);
    pcVar19 = "Unknown code element: %s\n";
LAB_0010c86b:
    parse_error(ls,pcVar19,pcVar11);
    return;
  case TOK_DOLLAR_DATA_REGISTER:
    buf._0_4_ = pTVar20->type;
    buf[4] = (ls->token).field_0x4;
    buf[5] = (ls->token).field_0x5;
    buf[6] = (ls->token).field_0x6;
    buf[7] = (ls->token).field_0x7;
    buf._8_4_ = *(undefined4 *)&(ls->token).u;
    buf._12_4_ = *(undefined4 *)((long)&(ls->token).u + 4);
    buf._16_4_ = *(undefined4 *)&(ls->token).filename;
    buf._20_4_ = *(undefined4 *)((long)&(ls->token).filename + 4);
    buf._24_4_ = *(undefined4 *)&(ls->token).lineno;
    buf._28_4_ = *(undefined4 *)((long)&(ls->token).lineno + 4);
    bVar23 = (ls->token).u.reginfo.sgnd == '\0';
    uVar10 = (ulong)(bVar23 + 0x53 + (uint)bVar23);
    pCVar14 = (CCVariant *)(ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size];
    pcVar11 = "DATA_REGISTER_%c%c (";
    goto LAB_0010cb80;
  case TOK_DOLLAR_ADDRESS_REGISTER:
    buf._0_4_ = pTVar20->type;
    buf[4] = (ls->token).field_0x4;
    buf[5] = (ls->token).field_0x5;
    buf[6] = (ls->token).field_0x6;
    buf[7] = (ls->token).field_0x7;
    buf._8_4_ = *(undefined4 *)&(ls->token).u;
    buf._12_4_ = *(undefined4 *)((long)&(ls->token).u + 4);
    buf._16_4_ = *(undefined4 *)&(ls->token).filename;
    buf._20_4_ = *(undefined4 *)((long)&(ls->token).filename + 4);
    buf._24_4_ = *(undefined4 *)&(ls->token).lineno;
    buf._28_4_ = *(undefined4 *)((long)&(ls->token).lineno + 4);
    bVar23 = (ls->token).u.reginfo.sgnd == '\0';
    uVar10 = (ulong)(bVar23 + 0x53 + (uint)bVar23);
    pCVar14 = (CCVariant *)(ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size];
    pcVar11 = "ADDRESS_REGISTER_%c%c ( ";
    goto LAB_0010cb80;
  case TOK_DOLLAR_GENERAL_REGISTER:
    buf._0_4_ = pTVar20->type;
    buf[4] = (ls->token).field_0x4;
    buf[5] = (ls->token).field_0x5;
    buf[6] = (ls->token).field_0x6;
    buf[7] = (ls->token).field_0x7;
    buf._8_4_ = *(undefined4 *)&(ls->token).u;
    buf._12_4_ = *(undefined4 *)((long)&(ls->token).u + 4);
    buf._16_4_ = *(undefined4 *)&(ls->token).filename;
    buf._20_4_ = *(undefined4 *)((long)&(ls->token).filename + 4);
    buf._24_4_ = *(undefined4 *)&(ls->token).lineno;
    buf._28_4_ = *(undefined4 *)((long)&(ls->token).lineno + 4);
    bVar23 = (ls->token).u.reginfo.sgnd == '\0';
    uVar10 = (ulong)(bVar23 + 0x53 + (uint)bVar23);
    pCVar14 = (CCVariant *)(ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size];
    pcVar11 = "GENERAL_REGISTER_%c%c (";
LAB_0010cb80:
    fprintf((FILE *)syn68k_c_stream,pcVar11,uVar10);
    (ls->token).type = TOK_DOLLAR_NUMBER;
    *(uchar *)&(ls->token).u = '\0';
    *(uchar *)((long)&(ls->token).u + 1) = '\x04';
    generate_code_for_list(ls,(int)pcVar11,info_01,pCVar14);
    aVar5._4_1_ = buf[0xc];
    aVar5._5_1_ = buf[0xd];
    aVar5._6_1_ = buf[0xe];
    aVar5._7_1_ = buf[0xf];
    aVar5._0_1_ = buf[8];
    aVar5._1_1_ = buf[9];
    aVar5._2_1_ = buf[10];
    aVar5._3_1_ = buf[0xb];
    (ls->token).filename = (char *)CONCAT44(buf._20_4_,buf._16_4_);
    (ls->token).lineno = CONCAT44(buf._28_4_,buf._24_4_);
    *(ulong *)pTVar20 = CONCAT44(buf._4_4_,buf._0_4_);
    (ls->token).u = aVar5;
LAB_0010cbae:
    fputs(") ",(FILE *)syn68k_c_stream);
    return;
  case TOK_DOLLAR_AMODE:
    uVar10 = (ulong)(ls->token).u.reginfo.size;
    uVar13 = (ulong)(ls->token).u.reginfo.sgnd;
    if (uVar10 != 4) {
      pcVar11 = ctypes[uVar13][uVar10];
      pcVar19 = "DEREF(%s, SYN68K_TO_US(cpu_state.amode_p)) ";
      goto LAB_0010cc9c;
    }
    uVar10 = (ulong)((uint)(uVar13 == 0) * 2 + 0x53);
    pcVar11 = "READ%cL_UNSWAPPED ( (cpu_state.amode_p)) ";
    goto LAB_0010cc31;
  case TOK_DOLLAR_REVERSED_AMODE:
    uVar10 = (ulong)(ls->token).u.reginfo.size;
    uVar13 = (ulong)(ls->token).u.reginfo.sgnd;
    if (uVar10 != 4) {
      pcVar11 = ctypes[uVar13][uVar10];
      pcVar19 = "DEREF(%s, SYN68K_TO_US(cpu_state.reversed_amode_p)) ";
      goto LAB_0010cc9c;
    }
    uVar10 = (ulong)((uint)(uVar13 == 0) * 2 + 0x53);
    pcVar11 = "READ%cL_UNSWAPPED ( (cpu_state.reversed_amode_p)) ";
    goto LAB_0010cc31;
  case TOK_DOLLAR_NUMBER:
    uVar10 = (ulong)(ls->token).u.reginfo.which;
    pcVar11 = "operand_%d ";
LAB_0010cc31:
    fprintf((FILE *)syn68k_c_stream,pcVar11,uVar10);
    return;
  case TOK_DOLLAR_AMODE_PTR:
    pcVar11 = " (cpu_state.amode_p) ";
    sStack_240 = 0x15;
    goto LAB_0010ca64;
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    pcVar11 = " (cpu_state.reversed_amode_p) ";
    sStack_240 = 0x1e;
LAB_0010ca64:
    fwrite(pcVar11,sStack_240,1,(FILE *)syn68k_c_stream);
    return;
  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
    uVar10 = (ulong)(ls->token).u.reginfo.size;
    uVar13 = (ulong)(ls->token).u.reginfo.sgnd;
    if (uVar10 != 4) {
      fprintf((FILE *)syn68k_c_stream,"DEREF(%s, CLEAN (",ctypes[uVar13][uVar10]);
      output_c_for_amode_ptr(pTVar20,(uint)(pTVar20->type == TOK_REVERSED_AMODE));
      goto LAB_0010c8c4;
    }
    fprintf((FILE *)syn68k_c_stream,"READ%cL_UNSWAPPED (CLEAN",
            (ulong)((uint)(uVar13 == 0) * 2 + 0x53));
    output_c_for_amode_ptr(pTVar20,(uint)(pTVar20->type == TOK_REVERSED_AMODE));
    goto LAB_0010c7c4;
  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
    fputs("(US_TO_SYN68K (",(FILE *)syn68k_c_stream);
    output_c_for_amode_ptr(pTVar20,(uint)(pTVar20->type == TOK_REVERSED_AMODE_PTR));
    pcVar11 = "))";
    break;
  case TOK_QUOTED_STRING:
    pcVar11 = (ls->token).u.string;
    pcVar19 = "%s ";
    goto LAB_0010cc9c;
  case TOK_NUMBER:
    pcVar11 = (char *)(ls->token).u.n;
    if (pcVar11 + -100 < (char *)0xffffffffffffff39) {
      pcVar19 = "((int32) 0x%lX) ";
    }
    else {
      pcVar19 = "%ld ";
    }
LAB_0010cc9c:
    fprintf((FILE *)syn68k_c_stream,pcVar19,pcVar11);
    return;
  case TOK_DATA_REGISTER:
    bVar23 = (ls->token).u.reginfo.sgnd == '\0';
    uVar16 = bVar23 + 0x53 + (uint)bVar23;
    cVar1 = "?BW?L"[(ls->token).u.reginfo.size];
    bVar2 = (ls->token).u.reginfo.which;
    pcVar11 = "DATA_REGISTER_%c%c (%d) ";
    goto LAB_0010cc03;
  case TOK_ADDRESS_REGISTER:
    bVar23 = (ls->token).u.reginfo.sgnd == '\0';
    uVar16 = bVar23 + 0x53 + (uint)bVar23;
    cVar1 = "?BW?L"[(ls->token).u.reginfo.size];
    bVar2 = (ls->token).u.reginfo.which;
    pcVar11 = "ADDRESS_REGISTER_%c%c (%d) ";
LAB_0010cc03:
    fprintf((FILE *)syn68k_c_stream,pcVar11,(ulong)uVar16,(ulong)(uint)(int)cVar1,(ulong)bVar2);
    return;
  case TOK_TEMP_REGISTER:
    fprintf((FILE *)syn68k_c_stream,"tmp%d%s ",(ulong)(ls->token).u.reginfo.which,
            regdesc[(ls->token).u.reginfo.sgnd][(ls->token).u.reginfo.size]);
    return;
  case TOK_NOP:
switchD_0010c773_caseD_23:
    return;
  case TOK_CCC:
    pcVar11 = "cpu_state.ccc ";
    break;
  case TOK_CCN:
    pcVar11 = "cpu_state.ccn ";
    break;
  case TOK_CCV:
    pcVar11 = "cpu_state.ccv ";
    break;
  case TOK_CCX:
    pcVar11 = "cpu_state.ccx ";
    break;
  case TOK_CCNZ:
    pcVar11 = "cpu_state.ccnz ";
    break;
  case TOK_CODE:
    pcVar11 = "code ";
    break;
  default:
    if (TVar4 != TOK_LIST) goto switchD_0010c773_caseD_2;
    ls = ls->car;
    if (ls == (List *)0x0) {
      return;
    }
    info_00 = &switchD_0010c839::switchdataD_00111b84;
    switch((ls->token).type) {
    case TOK_IF:
      pFVar18 = syn68k_c_stream;
      fputs("if (",(FILE *)syn68k_c_stream);
      generate_code_for_list(ls->cdr,(int)pFVar18,info_07,(CCVariant *)info_00);
      pFVar18 = syn68k_c_stream;
      fputs(") { ",(FILE *)syn68k_c_stream);
      generate_code_for_list(ls->cdr->cdr,(int)pFVar18,info_08,(CCVariant *)info_00);
      fputs(";} ",(FILE *)syn68k_c_stream);
      if (ls->cdr->cdr->cdr == (ListStruct *)0x0) {
        return;
      }
      pFVar18 = syn68k_c_stream;
      fputs("else { ",(FILE *)syn68k_c_stream);
      generate_code_for_list(ls->cdr->cdr->cdr,(int)pFVar18,info_09,(CCVariant *)info_00);
      pcVar11 = ";} ";
      break;
    case TOK_SWITCH:
      pFVar18 = syn68k_c_stream;
      fputs("switch (",(FILE *)syn68k_c_stream);
      generate_code_for_list(ls->cdr,(int)pFVar18,info_02,(CCVariant *)info_00);
      fputs(") {\n",(FILE *)syn68k_c_stream);
      pLVar15 = ls->cdr;
      while (pLVar15 = pLVar15->cdr, pLVar15 != (ListStruct *)0x0) {
        if ((pLVar15->car->token).type == TOK_DEFAULT) {
          pcVar11 = "        default: ";
        }
        else {
          pFVar18 = syn68k_c_stream;
          fputs("        case ",(FILE *)syn68k_c_stream);
          generate_code_for_list(pLVar15->car,(int)pFVar18,info_03,(CCVariant *)info_00);
          pcVar11 = ": ";
        }
        pFVar18 = syn68k_c_stream;
        fputs(pcVar11,(FILE *)syn68k_c_stream);
        generate_code_for_list(pLVar15->car->cdr,(int)pFVar18,info_04,(CCVariant *)info_00);
        fputs("; break;\n",(FILE *)syn68k_c_stream);
      }
      pcVar11 = "}\n        ";
      break;
    case TOK_DEFAULT:
      pcVar11 = "default ";
      break;
    case TOK_AND:
      pLVar15 = ls->cdr;
      pcVar11 = "&&";
      goto LAB_0010d07a;
    case TOK_OR:
      pLVar15 = ls->cdr;
      pcVar11 = "||";
      goto LAB_0010d07a;
    case TOK_XOR:
      while (ls = ls->cdr, ls != (List *)0x0) {
        pFVar18 = syn68k_c_stream;
        fputs("(!",(FILE *)syn68k_c_stream);
        generate_code_for_list(ls,(int)pFVar18,info_10,(CCVariant *)info_00);
        fputs(") ",(FILE *)syn68k_c_stream);
        if (ls->cdr != (ListStruct *)0x0) {
          fputs("^ ",(FILE *)syn68k_c_stream);
        }
      }
      return;
    case TOK_NOT:
      if (ls->cdr == (ListStruct *)0x0) {
        pcVar11 = "\"not\" missing an argument!\n";
LAB_0010d21e:
        parse_error(ls,pcVar11);
        goto switchD_0010c773_caseD_0;
      }
      pcVar11 = "(!";
      goto LAB_0010cfea;
    case TOK_EQUAL:
      pLVar15 = ls->cdr;
      pcVar11 = "==";
      goto LAB_0010d07a;
    case TOK_NOT_EQUAL:
      pLVar15 = ls->cdr;
      pcVar11 = "!=";
LAB_0010d07a:
      binary_op_list(pcVar11,pLVar15,(int)info,
                     (ParsedOpcodeInfo *)&switchD_0010c839::switchdataD_00111b84,in_R8);
      return;
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
      unparse_token(&ls->token,buf);
      binary_op_list(buf,ls->cdr,m68kop_00,(ParsedOpcodeInfo *)info_00,in_R8);
      return;
    default:
      pcVar11 = unparse_token(&ls->token,buf);
      pcVar19 = "Unknown operator for code list: %s\n";
      goto LAB_0010c86b;
    case TOK_NOP:
      goto switchD_0010c773_caseD_23;
    case TOK_ASSIGN:
      putc(0x28,(FILE *)syn68k_c_stream);
      pLVar15 = ls->cdr;
      TVar4 = (pLVar15->token).type;
      TVar8 = TVar4;
      if (TVar4 != TOK_LIST) {
LAB_0010d142:
        if (((TOK_REVERSED_AMODE < TVar8) || ((0x18c0000U >> (TVar8 & TOK_RIGHT_PAREN) & 1) == 0))
           || ((pLVar15->token).u.reginfo.size != '\x04')) {
          if (TVar4 == TOK_LIST) goto LAB_0010cbae;
          goto LAB_0010d258;
        }
        iVar7 = 0x111f11;
        fprintf((FILE *)syn68k_c_stream,"WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
                (ulong)((uint)((pLVar15->token).u.reginfo.sgnd == '\0') * 2 + 0x53));
        pLVar21 = ls->cdr;
        TVar4 = (pLVar21->token).type;
        if (TVar4 == TOK_AMODE) {
          (pLVar21->token).type = TOK_AMODE_PTR;
          generate_code_for_list(pLVar21,iVar7,info_11,(CCVariant *)pLVar15);
          (ls->cdr->token).type = TOK_AMODE;
        }
        else {
          if (TVar4 == TOK_DOLLAR_REVERSED_AMODE) {
            pcVar11 = " (cpu_state.reversed_amode_p) ";
          }
          else {
            if (TVar4 != TOK_DOLLAR_AMODE) {
              (pLVar21->token).type = TOK_REVERSED_AMODE_PTR;
              generate_code_for_list(pLVar21,iVar7,info_11,(CCVariant *)pLVar15);
              (ls->cdr->token).type = TOK_REVERSED_AMODE;
              goto LAB_0010d45b;
            }
            pcVar11 = " (cpu_state.amode_p) ";
          }
          fputs(pcVar11,(FILE *)syn68k_c_stream);
        }
LAB_0010d45b:
        pFVar18 = syn68k_c_stream;
        fputs(")), ",(FILE *)syn68k_c_stream);
        iVar7 = (int)pFVar18;
        pLVar12 = ls->cdr->cdr;
        pPVar17 = extraout_RDX_12;
LAB_0010d470:
        generate_code_for_list(pLVar12,iVar7,pPVar17,(CCVariant *)pLVar15);
        fputs(") ",(FILE *)syn68k_c_stream);
        goto LAB_0010cbae;
      }
      pLVar12 = pLVar15->car;
      if (((pLVar12->token).type == TOK_DEREF) && ((pLVar12->token).u.reginfo.size == '\x04')) {
        bVar23 = (pLVar12->token).u.reginfo.sgnd == '\0';
        pCVar14 = (CCVariant *)(ulong)bVar23;
        iVar7 = 0x111f11;
        fprintf((FILE *)syn68k_c_stream,"WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
                (ulong)((uint)bVar23 * 2 + 0x53));
        generate_code_for_list(ls->cdr->car->cdr,iVar7,info_05,pCVar14);
        pFVar18 = syn68k_c_stream;
        fputs(")), ",(FILE *)syn68k_c_stream);
        generate_code_for_list(ls->cdr->cdr,(int)pFVar18,info_06,pCVar14);
        fputs(") ",(FILE *)syn68k_c_stream);
        pLVar15 = ls->cdr;
        TVar8 = (pLVar15->token).type;
        goto LAB_0010d142;
      }
LAB_0010d258:
      if ((pLVar15->cdr->token).type == TOK_LIST) {
        iVar7 = list_length(pLVar15->cdr->car);
        pLVar15 = ls->cdr;
        if (iVar7 != 3) goto LAB_0010d333;
        BVar9 = tokens_equal(&pLVar15->cdr->car->cdr->token,&pLVar15->token);
        pLVar15 = ls->cdr;
        if (BVar9 == FALSE) goto LAB_0010d333;
        if ((pLVar15->token).type == TOK_LIST) {
          BVar9 = lists_equal(pLVar15->car,pLVar15->cdr->car->cdr->car);
          pLVar15 = ls->cdr;
          if (BVar9 == FALSE) goto LAB_0010d333;
        }
        pPVar17 = (ParsedOpcodeInfo *)pLVar15->cdr->car;
        uVar16 = *(uint *)&pPVar17->amode;
        if ((0x35 < (ulong)uVar16) || ((0x3fd80000000000U >> ((ulong)uVar16 & 0x3f) & 1) == 0))
        goto LAB_0010d333;
        if (((pLVar15->token).type == TOK_ADDRESS_REGISTER) &&
           ((pLVar15->token).u.reginfo.size == '\x02')) {
          (pLVar15->token).u.reginfo.size = '\x04';
          generate_code_for_list(ls->cdr,0,pPVar17,(CCVariant *)pLVar15);
          pcVar11 = unparse_token(&ls->cdr->cdr->car->token,buf);
          fputs(pcVar11,(FILE *)syn68k_c_stream);
          pcVar11 = "= (int16)";
        }
        else {
          if (((uVar16 & 0xfffffffe) == 0x2e) &&
             (pPVar17 = *(ParsedOpcodeInfo **)pPVar17->name, *(int *)&pPVar17->amode == 0x1d)) {
            pLVar21 = pPVar17->misc_flags;
            if ((pLVar21 == (List *)0x1) || (pLVar21 == (List *)0xffffffffffffffff)) {
              bVar23 = (pLVar21 == (List *)0xffffffffffffffff) != (uVar16 == 0x2e);
              pLVar15 = (ListStruct *)CONCAT71((int7)((ulong)pLVar15 >> 8),bVar23);
              pcVar11 = "(--";
              if (bVar23) {
                pcVar11 = "(++";
              }
              pFVar18 = syn68k_c_stream;
              fputs(pcVar11,(FILE *)syn68k_c_stream);
              iVar7 = (int)pFVar18;
              pLVar12 = ls->cdr;
              pPVar17 = extraout_RDX_13;
              goto LAB_0010d470;
            }
            if (((pLVar15->token).u.reginfo.size == '\x04') &&
               ((pLVar15->token).u.string != (char *)0xffffffff80000000)) {
              uVar22 = (uint)pLVar21;
              if ((int)uVar22 < 0) {
                pcVar11 = "(INC_VAR (";
                if (uVar16 == 0x2e) {
                  pcVar11 = "(DEC_VAR (";
                }
                pFVar18 = syn68k_c_stream;
                fputs(pcVar11,(FILE *)syn68k_c_stream);
                generate_code_for_list(ls->cdr,(int)pFVar18,info_14,(CCVariant *)pLVar15);
                uVar22 = -uVar22;
              }
              else {
                pcVar11 = "(DEC_VAR (";
                if (uVar16 == 0x2e) {
                  pcVar11 = "(INC_VAR (";
                }
                pFVar18 = syn68k_c_stream;
                fputs(pcVar11,(FILE *)syn68k_c_stream);
                generate_code_for_list(ls->cdr,(int)pFVar18,info_13,(CCVariant *)pLVar15);
                uVar22 = uVar22 & 0x7fffffff;
              }
              fprintf((FILE *)syn68k_c_stream,", %ld)) ",(ulong)uVar22);
              goto LAB_0010cbae;
            }
          }
          generate_code_for_list(pLVar15,uVar16 & 0xfffffffe,pPVar17,(CCVariant *)pLVar15);
          pcVar11 = unparse_token(&ls->cdr->cdr->car->token,buf);
          fputs(pcVar11,(FILE *)syn68k_c_stream);
          pcVar11 = "= ";
        }
        pFVar18 = syn68k_c_stream;
        fputs(pcVar11,(FILE *)syn68k_c_stream);
        iVar7 = (int)pFVar18;
        pLVar12 = ls->cdr->cdr->car->cdr;
        pPVar17 = extraout_RDX_14;
LAB_0010d3ad:
        pLVar12 = pLVar12->cdr;
      }
      else {
LAB_0010d333:
        ppLVar6 = &pLVar15->cdr;
        pLVar15 = (ListStruct *)&pLVar15->token;
        pTVar20 = &(*ppLVar6)->token;
        BVar9 = tokens_equal((Token *)pLVar15,pTVar20);
        iVar7 = (int)pTVar20;
        pPVar17 = extraout_RDX_08;
        if (BVar9 == FALSE) {
LAB_0010d372:
          pLVar21 = ls->cdr;
          if (((pLVar21->token).type == TOK_ADDRESS_REGISTER) &&
             ((pLVar21->token).u.reginfo.size == '\x02')) {
            (pLVar21->token).u.reginfo.size = '\x04';
            generate_code_for_list(ls->cdr,iVar7,pPVar17,(CCVariant *)pLVar15);
            pcVar11 = "= (int16) ";
          }
          else {
            generate_code_for_list(pLVar21,iVar7,pPVar17,(CCVariant *)pLVar15);
            pcVar11 = "= ";
          }
          pFVar18 = syn68k_c_stream;
          fputs(pcVar11,(FILE *)syn68k_c_stream);
          iVar7 = (int)pFVar18;
          pLVar12 = ls->cdr;
          pPVar17 = extraout_RDX_10;
          goto LAB_0010d3ad;
        }
        pLVar15 = ls->cdr->cdr;
        pLVar21 = pLVar15->car;
        BVar9 = lists_equal(ls->cdr->car,pLVar21);
        iVar7 = (int)pLVar21;
        pPVar17 = extraout_RDX_09;
        if (BVar9 == FALSE) goto LAB_0010d372;
        pLVar12 = ls->cdr;
      }
      generate_code_for_list(pLVar12,iVar7,pPVar17,(CCVariant *)pLVar15);
      goto LAB_0010cbae;
    case TOK_BITWISE_NOT:
      if (ls->cdr == (ListStruct *)0x0) {
        pcVar11 = "\"~\" missing an argument!\n";
        goto LAB_0010d21e;
      }
      pcVar11 = "(~";
LAB_0010cfea:
      pFVar18 = syn68k_c_stream;
      fputs(pcVar11,(FILE *)syn68k_c_stream);
      iVar7 = (int)pFVar18;
      pLVar15 = ls->cdr;
      pPVar17 = extraout_RDX_01;
LAB_0010cff2:
      generate_code_for_list(pLVar15,iVar7,pPVar17,(CCVariant *)info_00);
LAB_0010c7c4:
      pcVar11 = ") ";
      break;
    case TOK_FUNC_CALL:
      pLVar15 = ls->cdr;
      if ((pLVar15 == (ListStruct *)0x0) || ((pLVar15->token).type != TOK_QUOTED_STRING)) {
        pcVar11 = "\"call\" must be followed by a function name in quotes.\n";
        goto LAB_0010d401;
      }
      pcVar11 = "%s (";
      fprintf((FILE *)syn68k_c_stream,"%s (",(pLVar15->token).u.string);
      pLVar15 = ls->cdr;
      pPVar17 = extraout_RDX_04;
      while (pLVar15 = pLVar15->cdr, pLVar15 != (List *)0x0) {
        generate_code_for_list(pLVar15,(int)pcVar11,pPVar17,(CCVariant *)info_00);
        pPVar17 = extraout_RDX_05;
        if (pLVar15->cdr != (ListStruct *)0x0) {
          pcVar11 = (char *)syn68k_c_stream;
          fputs(", ",(FILE *)syn68k_c_stream);
          pPVar17 = extraout_RDX_06;
        }
      }
      goto LAB_0010c7c4;
    case TOK_CAST:
      pLVar15 = ls->cdr;
      if ((pLVar15 == (ListStruct *)0x0) || ((pLVar15->token).type != TOK_QUOTED_STRING)) {
        pcVar11 = "\"cast\" must be followed by a C type in quotes.\n";
        goto LAB_0010d401;
      }
      iVar7 = 0x112166;
      fprintf((FILE *)syn68k_c_stream,"((%s) ",(pLVar15->token).u.string);
      pLVar15 = ls->cdr->cdr;
      pPVar17 = extraout_RDX_03;
      goto LAB_0010cff2;
    case TOK_DEREF:
      uVar3 = (ls->token).u.reginfo.size;
      iVar7 = list_length(ls);
      if (uVar3 != '\0') {
        if (iVar7 != 2) {
          pcVar11 = "Typed deref must have exactly one argument!\n";
          goto LAB_0010d401;
        }
        uVar10 = (ulong)(ls->token).u.reginfo.size;
        pCVar14 = (CCVariant *)(ulong)(ls->token).u.reginfo.sgnd;
        if (uVar10 == 4) {
          iVar7 = 0x1121bf;
          fprintf((FILE *)syn68k_c_stream,"READ%cL_UNSWAPPED ((CLEAN (",
                  (ulong)((uint)(pCVar14 == (CCVariant *)0x0) * 2 + 0x53));
          pPVar17 = extraout_RDX;
        }
        else {
          pCVar14 = (CCVariant *)((long)pCVar14 * 0x28);
          iVar7 = 0x11219f;
          fprintf((FILE *)syn68k_c_stream,"DEREF(%s, SYN68K_TO_US (CLEAN (",
                  (&pCVar14[0x6fee].code)[uVar10]);
          pPVar17 = extraout_RDX_11;
        }
        generate_code_for_list(ls->cdr,iVar7,pPVar17,pCVar14);
        pcVar11 = "))) ";
        break;
      }
      if (iVar7 != 4) {
        pcVar11 = "Untyped deref requires three args (ptr type, value, offset).\n";
LAB_0010d401:
        parse_error(ls,pcVar11);
        return;
      }
      if ((ls->cdr->token).type != TOK_QUOTED_STRING) {
        pcVar11 = "Untyped deref must have second arg be a quoted string C type.\n";
        goto LAB_0010d401;
      }
      iVar7 = 0x112163;
      fprintf((FILE *)syn68k_c_stream,"(*(((%s) ",(ls->cdr->token).u.string);
      generate_code_for_list(ls->cdr->cdr,iVar7,info_12,(CCVariant *)info_00);
      pFVar18 = syn68k_c_stream;
      fputs(") + ",(FILE *)syn68k_c_stream);
      iVar7 = (int)pFVar18;
      pLVar15 = ls->cdr->cdr->cdr;
      pPVar17 = extraout_RDX_07;
      goto LAB_0010cd6f;
    case TOK_SWAP:
      info_00 = (uint *)((ulong)((ls->cdr->token).type == TOK_NUMBER) * 0x50);
      pFVar18 = syn68k_c_stream;
      fputs(*(char **)(&((CCVariant *)((long)info_00 + (ulong)(ls->token).u.reginfo.sgnd * 0x28))->
                        field_0x0 +
                      (long)(generate_code_for_list::swap_macro[0][0] + (ls->token).u.reginfo.size))
            ,(FILE *)syn68k_c_stream);
      iVar7 = (int)pFVar18;
      pLVar15 = ls->cdr;
      pPVar17 = extraout_RDX_00;
LAB_0010cd6f:
      generate_code_for_list(pLVar15,iVar7,pPVar17,(CCVariant *)info_00);
LAB_0010c8c4:
      pcVar11 = ")) ";
      break;
    case TOK_EXPLICIT_LIST:
      while (ls = ls->cdr, ls != (List *)0x0) {
        generate_code_for_list(ls,(int)pFVar18,info,(CCVariant *)info_00);
        fputs(";\n",(FILE *)syn68k_c_stream);
        pFVar18 = syn68k_c_stream;
        fputs("        ",(FILE *)syn68k_c_stream);
        info = extraout_RDX_02;
      }
      return;
    }
  }
  fputs(pcVar11,(FILE *)syn68k_c_stream);
  return;
}

Assistant:

static void
generate_code_for_list (List *ls, int m68kop, const ParsedOpcodeInfo *info,
			const CCVariant *var)
{
  char buf[512];
  Token *t;
  BOOL done;

  if (ls == NULL)
    return;

  /* If they have several sublists of code, generate code for each of them. */
  t = &ls->token;
  switch (t->type) {

    /* If we've found a list, look at the operator for that list and
     * generate code appropriately. */
  case TOK_LIST:
    if (ls->car == NULL)
      return;
    ls = ls->car;
    t = &ls->token;

    switch (ls->token.type) {
    case TOK_EXPLICIT_LIST:
      /* Loop over all the lists of code and generate c for them. */
      for (ls = ls->cdr; ls != NULL; ls = ls->cdr)
	{
	  generate_code_for_list (ls, m68kop, info, var);
	  fputs (";\n", syn68k_c_stream);
	  fputs ("        ", syn68k_c_stream);
	}
      break;

    case TOK_ASSIGN:
      putc ('(', syn68k_c_stream);
      done = FALSE;

      /* If they are writing out to a long, generate appropriate code
       * that will work on a QUADALIGN machine.
       */
      if (ls->cdr->token.type == TOK_LIST
	  && CADR (ls)->token.type == TOK_DEREF
	  && CADR (ls)->token.u.derefinfo.size == 4)
	{
	  fprintf (syn68k_c_stream,
		   "WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
		   CADR (ls)->token.u.derefinfo.sgnd ? 'S' : 'U');
	  generate_code_for_list (CDADR (ls), m68kop, info, var);
	  fputs (")), ", syn68k_c_stream);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  done = TRUE;
	}
      if ((ls->cdr->token.type == TOK_AMODE
	   || ls->cdr->token.type == TOK_REVERSED_AMODE
	   || ls->cdr->token.type == TOK_DOLLAR_AMODE
	   || ls->cdr->token.type == TOK_DOLLAR_REVERSED_AMODE)
	  && ls->cdr->token.u.amodeinfo.size == 4)
	{
	  fprintf (syn68k_c_stream,
		   "WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
		   ls->cdr->token.u.derefinfo.sgnd ? 'S' : 'U');
	  switch (ls->cdr->token.type) {
	  case TOK_DOLLAR_AMODE:
	    fputs (" (cpu_state.amode_p) ", syn68k_c_stream);
	    break;
	  case TOK_DOLLAR_REVERSED_AMODE:
	    fputs (" (cpu_state.reversed_amode_p) ",
		   syn68k_c_stream);
	    break;
	  case TOK_AMODE:
	    ls->cdr->token.type = TOK_AMODE_PTR;
	    generate_code_for_list (ls->cdr, m68kop, info, var);
	    ls->cdr->token.type = TOK_AMODE;
	    break;
	  case TOK_REVERSED_AMODE:
	  default:
	    ls->cdr->token.type = TOK_REVERSED_AMODE_PTR;
	    generate_code_for_list (ls->cdr, m68kop, info, var);
	    ls->cdr->token.type = TOK_REVERSED_AMODE;
	    break;
	  }
	  fputs (")), ", syn68k_c_stream);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  done = TRUE;
	}


      /* Do stuff like (assign d0.ul.n (+ d0.ul.n 5)) -> "d0.ul.n += 5" */
      if (!done && CDDR (ls)->token.type == TOK_LIST
	  && list_length (CADDR (ls)) == 3
	  && tokens_equal (&CDR (CADDR (ls))->token, &CDR (ls)->token))
	{
	  if (CDR (ls)->token.type != TOK_LIST
	      || lists_equal (CADR (ls), CADR (CADDR (ls))))
	    {
	      switch (CADDR (ls)->token.type) {
	      case TOK_BITWISE_AND:
	      case TOK_BITWISE_OR:
	      case TOK_BITWISE_XOR:
	      case TOK_PLUS:
	      case TOK_MINUS:
	      case TOK_MULTIPLY:
	      case TOK_DIVIDE:
	      case TOK_MOD:
	      case TOK_SHIFT_LEFT:
	      case TOK_SHIFT_RIGHT:
		/* Word-sized operations to address registers deal with
		 * the entire address register; the RHS is sign extended.
		 */
		if (ls->cdr->token.type == TOK_ADDRESS_REGISTER
		    && ls->cdr->token.u.reginfo.size == 2)
		  {
		    ls->cdr->token.u.reginfo.size = 4;
		    generate_code_for_list (ls->cdr, m68kop, info, var);
		    fputs (unparse_token (&CADDR (ls)->token, buf),
			   syn68k_c_stream);
		    fputs ("= (int16)", syn68k_c_stream);
		    generate_code_for_list (CDDR (CADDR (ls)), m68kop,
					    info, var);
		  }
		else  /* Not a word-sized op to an address register. */
		  {
		    TokenType optype = CADDR (ls)->token.type;

		    /* Change foo += 1 to ++foo.  Why?  It turns out
		     * that gcc sometimes generates better code for ++foo.
		     * Annoying, isn't it?
		     */
		    if ((optype == TOK_PLUS || optype == TOK_MINUS)
			&& CDDR (CADDR (ls))->token.type == TOK_NUMBER
			&& (CDDR (CADDR (ls))->token.u.n == 1
			    || CDDR (CADDR (ls))->token.u.n == -1))
		      {
			if ((optype == TOK_PLUS)
			    ^ (CDDR (CADDR (ls))->token.u.n == -1))
			  fputs ("(++", syn68k_c_stream);
			else
			  fputs ("(--", syn68k_c_stream);
			generate_code_for_list (ls->cdr, m68kop, info, var);
			fputs (") ", syn68k_c_stream);
		      }
		    /* Change foo += 5 to a weird macro...this also seems
		     * to help gcc.
		     */
		    else if ((optype == TOK_PLUS || optype == TOK_MINUS)
			     && CDDR (CADDR (ls))->token.type == TOK_NUMBER
			     && ls->cdr->token.u.reginfo.size == 4
			     && ls->cdr->token.u.n != (int32) 0x80000000)
		      {
			int32 val = CDDR (CADDR (ls))->token.u.n;
			if (val >= 0)
			  {
			    if (optype == TOK_PLUS)
			      fputs ("(INC_VAR (", syn68k_c_stream);
			    else
			      fputs ("(DEC_VAR (", syn68k_c_stream);
			    generate_code_for_list (ls->cdr, m68kop, info,
						    var);
			    fprintf (syn68k_c_stream, ", %ld)) ", (long) val);
			  }
			else  /* val < 0 */
			  {
			    if (optype == TOK_PLUS)
			      fputs ("(DEC_VAR (", syn68k_c_stream);
			    else
			      fputs ("(INC_VAR (", syn68k_c_stream);
			    generate_code_for_list (ls->cdr, m68kop, info,
						    var);
			    fprintf (syn68k_c_stream, ", %ld)) ", (long) -val);
			  }
		      }
		    else
		      {
			generate_code_for_list (ls->cdr, m68kop, info, var);
			fputs (unparse_token (&CADDR (ls)->token, buf),
			       syn68k_c_stream);
			fputs ("= ", syn68k_c_stream);
			generate_code_for_list (CDDR (CADDR (ls)), m68kop,
						info, var);
		      }
		  }
		done = TRUE;
		break;
	      default:
		break;
	      }
	    }
	}

      /* See if we are assigning something to itself.  This can happen
       * when expanding out code, and gcc hasn't been eliminating these
       * pointless assigns.  Here we just output the LHS of the assignment,
       * in case the value of the assignment as a whole is being used for
       * something (eg, "d0.ul.n = d0.ul.n"  ->  "d0.ul.n")
       */
      if (!done)
	{
	  if (tokens_equal (&ls->cdr->token, &(CDDR (ls))->token)
	      && lists_equal (CADR (ls), CADDR (ls)))
	    {
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      done = TRUE;
	    }
	}

      if (!done)
	{
	  /* Force word moves into address registers to be sign extended. */
	  if (ls->cdr->token.type == TOK_ADDRESS_REGISTER
	      && ls->cdr->token.u.reginfo.size == 2)
	    {
	      ls->cdr->token.u.reginfo.size = 4;
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("= (int16) ", syn68k_c_stream);
	    }
	  else
	    {
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("= ", syn68k_c_stream);
	    }
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	}
      fputs (") ", syn68k_c_stream);
      break;

      /* Have to special case boolean xor since C doesn't have ^^ analagous to
       * && and ||.
       */
    case TOK_XOR:
      for (ls = ls->cdr; ls != NULL; ls = ls->cdr)
	{
	  fputs ("(!", syn68k_c_stream);
	  generate_code_for_list (ls, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  if (ls->cdr != NULL)
	    fputs ("^ ", syn68k_c_stream);
	}
      break;
    case TOK_NOT:
      if (ls->cdr == NULL)
	{
	  parse_error (ls, "\"not\" missing an argument!\n");
	  fputs ("0 ", syn68k_c_stream);
	}
      else
	{
	  fputs ("(!", syn68k_c_stream);
	  generate_code_for_list (ls->cdr, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_BITWISE_NOT:
      if (ls->cdr == NULL)
	{
	  parse_error (ls, "\"~\" missing an argument!\n");
	  fputs ("0 ", syn68k_c_stream);
	}
      else
	{
	  fputs ("(~", syn68k_c_stream);
	  generate_code_for_list (ls->cdr, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_AND:
      binary_op_list ("&&", ls->cdr, m68kop, info, var);
      break;
    case TOK_OR:
      binary_op_list ("||", ls->cdr, m68kop, info, var);
      break;
    case TOK_EQUAL:
      binary_op_list ("==", ls->cdr, m68kop, info, var);  /* 2 args but OK. */
      break;
    case TOK_NOT_EQUAL:
      binary_op_list ("!=", ls->cdr, m68kop, info, var);  /* 2 args but OK. */
      break;
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_LESS_OR_EQUAL:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
      unparse_token (&ls->token, buf);
      binary_op_list (buf, ls->cdr, m68kop, info, var);
      break;

    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      unparse_token (&ls->token, buf);
      binary_op_list (buf, ls->cdr, m68kop, info, var);
      break;

    case TOK_DEFAULT:
      fputs ("default ", syn68k_c_stream);
      break;

    case TOK_SWITCH:
      fputs ("switch (", syn68k_c_stream);
      generate_code_for_list (ls->cdr, m68kop, info, var);
      fputs (") {\n", syn68k_c_stream);
      for (ls = CDDR (ls); ls != NULL; ls = ls->cdr)
	{
	  if (ls->car->token.type == TOK_DEFAULT)
	    fputs ("        default: ", syn68k_c_stream);
	  else
	    {
	      fputs ("        case ", syn68k_c_stream);
	      generate_code_for_list (ls->car, m68kop, info, var);
	      fputs (": ", syn68k_c_stream);
	    }
	  generate_code_for_list (CDAR (ls), m68kop, info, var);
	  fputs ("; break;\n", syn68k_c_stream);
	}
      fputs ("}\n        ", syn68k_c_stream);
      break;

    case TOK_IF:
      fputs ("if (", syn68k_c_stream);
      generate_code_for_list (ls->cdr, m68kop, info, var);
      fputs (") { ", syn68k_c_stream);
      generate_code_for_list (CDDR (ls), m68kop, info, var);
      fputs (";} ", syn68k_c_stream);
      if (CDDDR (ls) != NULL)
	{
	  fputs ("else { ", syn68k_c_stream);
	  generate_code_for_list (CDDDR (ls), m68kop, info, var);
	  fputs (";} ", syn68k_c_stream);
	}
      break;

    case TOK_SWAP:
      {
	static const char *swap_macro[2][2][5] = {
	  {{ "ERR", "((uint8) (", "(SWAPUW_IFLE (", "ERR", "(SWAPUL_IFLE (" },
	   { "ERR", "((int8) (",  "(SWAPSW_IFLE (", "ERR", "(SWAPSL_IFLE (" }},
	  {{ "ERR", "((uint8) (", "(SWAPUW_IFLE (", "ERR",
	       "(SWAPUL_IFLE (" },
	   { "ERR", "((int8) (",  "(SWAPSW_IFLE (", "ERR",
	       "(SWAPSL_IFLE (" }}
	};

	fputs (swap_macro[(ls->cdr->token.type == TOK_NUMBER)]
			  [t->u.swapinfo.sgnd][t->u.swapinfo.size],
	       syn68k_c_stream);
	generate_code_for_list (ls->cdr, m68kop, info, var);
	fputs (")) ", syn68k_c_stream);
      }
      break;

    case TOK_CAST:
      if (ls->cdr == NULL || ls->cdr->token.type != TOK_QUOTED_STRING)
	{
	  parse_error (ls, "\"cast\" must be followed by a C type "
		       "in quotes.\n");
	}
      else
	{
	  fprintf (syn68k_c_stream, "((%s) ", ls->cdr->token.u.string);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_DEREF:
      if (t->u.derefinfo.size == 0)  /* Untyped deref? */
	{
	  if (list_length (ls) != 4)
	    parse_error (ls, "Untyped deref requires three args (ptr type, "
			 "value, offset).\n");
	  else if (ls->cdr->token.type != TOK_QUOTED_STRING)
	    parse_error (ls, "Untyped deref must have second arg be "
			 "a quoted string C type.\n");
	  else
	    {
	      /* We intentionally leave out the CLEAN here; you don't
	       * want to CLEAN the code pointer, for instance!  In general
	       * if you use an untyped deref you have to be more careful...
	       */
	      fprintf (syn68k_c_stream, "(*(((%s) ",
		       ls->cdr->token.u.string);
	      generate_code_for_list (CDDR (ls), m68kop, info, var);
	      fputs (") + ", syn68k_c_stream);
	      generate_code_for_list (CDDDR (ls), m68kop, info, var);
	      fputs (")) ", syn68k_c_stream);
	    }
	}
      else
	{
	  if (list_length (ls) != 2)
	    parse_error (ls, "Typed deref must have exactly one argument!\n");
	  else
	    {
	      if (t->u.derefinfo.size != 4)
		fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US (CLEAN (",
			 ctypes[t->u.derefinfo.sgnd][t->u.derefinfo.size]);
	      else
		fprintf (syn68k_c_stream,
			 "READ%cL_UNSWAPPED ((CLEAN (",
			 t->u.derefinfo.sgnd ? 'S' : 'U');
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("))) ", syn68k_c_stream);
	    }
	}
      break;

    case TOK_FUNC_CALL:
      if (ls->cdr == NULL || ls->cdr->token.type != TOK_QUOTED_STRING)
	{
	  parse_error (ls, "\"call\" must be followed by a function name "
		       "in quotes.\n");
	}
      else
	{
	  List *l2;
	  fprintf (syn68k_c_stream, "%s (", ls->cdr->token.u.string);
	  for (l2 = CDDR (ls); l2 != NULL; l2 = l2->cdr)
	    {
	      generate_code_for_list (l2, m68kop, info, var);
	      if (l2->cdr != NULL)
		fputs (", ", syn68k_c_stream);
	    }
	  fputs (") ", syn68k_c_stream);
	}
      break;

      /* Skip NOPs, however they were introduced. */
    case TOK_NOP:
      break;

    default:
      parse_error (ls, "Unknown operator for code list: %s\n",
		   unparse_token (&ls->token, buf));
      break;
    }
    break;

    /* Skip NOPs, however they were introduced. */
  case TOK_NOP:
    break;

  case TOK_TRUE:
    fputs ("1 ", syn68k_c_stream);
    break;

  case TOK_FALSE:
    fputs ("0 ", syn68k_c_stream);
    break;

  case TOK_CODE:
    fputs ("code ", syn68k_c_stream);
    break;

  case TOK_DOLLAR_DATA_REGISTER:
    {
      Token temp = *t;
      /* Compensate for gcc i386 brain damage. */
      fprintf (syn68k_c_stream, "DATA_REGISTER_%c%c (",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_DOLLAR_ADDRESS_REGISTER:
    {
      Token temp = *t;
      fprintf (syn68k_c_stream, "ADDRESS_REGISTER_%c%c ( ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_DOLLAR_GENERAL_REGISTER:
    {
      Token temp = *t;
      fprintf (syn68k_c_stream, "GENERAL_REGISTER_%c%c (",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_TEMP_REGISTER:
    fprintf (syn68k_c_stream, "tmp%d%s ", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;

  case TOK_DATA_REGISTER:
    fprintf (syn68k_c_stream, "DATA_REGISTER_%c%c (%d) ",
	     t->u.dollarinfo.sgnd ? 'S' : 'U',
	     "?BW?L"[t->u.dollarinfo.size],
	     t->u.reginfo.which);
    break;

  case TOK_ADDRESS_REGISTER:
    fprintf (syn68k_c_stream, "ADDRESS_REGISTER_%c%c (%d) ",
	     t->u.dollarinfo.sgnd ? 'S' : 'U',
	     "?BW?L"[t->u.dollarinfo.size],
	     t->u.reginfo.which);
    break;

  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
    fputs ("(US_TO_SYN68K (", syn68k_c_stream);
    output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE_PTR));
    fputs ("))", syn68k_c_stream);
    break;

  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
    if (t->u.dollarinfo.size != 4)
      {
	fprintf (syn68k_c_stream, "DEREF(%s, CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (")) ", syn68k_c_stream);
      }
    else
      {
#if 0
	fputs ("\n"
	       "#ifdef QUADALIGN\n"
	       "# ifdef BIGENDIAN\n", syn68k_c_stream);

	fprintf (syn68k_c_stream, "((%s) (((((uint16 *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[0]) << 16) | (((uint16 *) CLEAN (", syn68k_c_stream);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[1])))\n", syn68k_c_stream);
	
	fputs ("# else\n", syn68k_c_stream);
	
	fprintf (syn68k_c_stream, "((%s) ((((uint16 *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[0]) | ((((uint16 *) CLEAN (", syn68k_c_stream);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[1]) << 16)))\n", syn68k_c_stream);

	fputs ("# endif\n"
	       "#else\n", syn68k_c_stream);
	fprintf (syn68k_c_stream, "(*(%s *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (")) ", syn68k_c_stream);
	fputs ("\n#endif\n", syn68k_c_stream);
#else
	fprintf (syn68k_c_stream, "READ%cL_UNSWAPPED (CLEAN",
		 t->u.dollarinfo.sgnd ? 'S' : 'U');
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (") ", syn68k_c_stream);
#endif
      }
    break;

  case TOK_NUMBER:
    if (t->u.n >= 100 || t->u.n <= -100)
      fprintf (syn68k_c_stream, "((int32) 0x%lX) ", (unsigned long)t->u.n);
    else fprintf (syn68k_c_stream, "%ld ", t->u.n);
    break;

    /* Pass quoted strings on to the C compiler. */
  case TOK_QUOTED_STRING:
    fprintf (syn68k_c_stream, "%s ", t->u.string);  /* Append a space. */
    break;

  case TOK_CCC:  fputs ("cpu_state.ccc ",  syn68k_c_stream); break;
  case TOK_CCN:  fputs ("cpu_state.ccn ",  syn68k_c_stream); break;
  case TOK_CCV:  fputs ("cpu_state.ccv ",  syn68k_c_stream); break;
  case TOK_CCX:  fputs ("cpu_state.ccx ",  syn68k_c_stream); break;
  case TOK_CCNZ: fputs ("cpu_state.ccnz ", syn68k_c_stream); break;

    /* If we still haven't been able to resolve the addressing mode,
     * a pointer to the data should have been put in the appropriate
     * local variable by a preceding instruction.
     */
  case TOK_DOLLAR_AMODE:
    if (t->u.dollarinfo.size != 4)
      fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US(cpu_state.amode_p)) ",
	       ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    else
      fprintf (syn68k_c_stream, "READ%cL_UNSWAPPED ( (cpu_state.amode_p)) ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U');
    break;

  case TOK_DOLLAR_REVERSED_AMODE:
    if (t->u.dollarinfo.size != 4)
      fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US(cpu_state.reversed_amode_p)) ",
	       ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    else
      fprintf (syn68k_c_stream,
	       "READ%cL_UNSWAPPED ( (cpu_state.reversed_amode_p)) ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U');
    break;

  case TOK_DOLLAR_AMODE_PTR:
    fprintf (syn68k_c_stream, " (cpu_state.amode_p) ");
    break;

  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    fprintf (syn68k_c_stream, " (cpu_state.reversed_amode_p) ");
    break;

  case TOK_DOLLAR_NUMBER:
#if	1 || !defined(TEMPS_AT_TOP)
    fprintf (syn68k_c_stream, "operand_%d ", t->u.dollarinfo.which);
#else	/* defined(TEMPS_AT_TOP) */
    fprintf (syn68k_c_stream, "operand_%s%d_%d ",
				t->u.dollarinfo.sgnd ? "" : "u",
				t->u.dollarinfo.size*8, t->u.dollarinfo.which);
#endif	/* defined(TEMPS_AT_TOP) */
    break;

  default:
    parse_error (ls, "Unknown code element: %s\n", unparse_token (t, buf));
    break;
  }
}